

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kliveness.c
# Opt level: O3

void modifyAigToApplySafetyInvar(Aig_Man_t *pAig,int csTarget,int safetyInvarPO)

{
  uint uVar1;
  void **ppvVar2;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pFaninNew;
  
  if (-1 < safetyInvarPO) {
    uVar1 = pAig->vCos->nSize;
    if (((safetyInvarPO < (int)uVar1) && (-1 < csTarget)) && ((uint)csTarget < uVar1)) {
      ppvVar2 = pAig->vCos->pArray;
      pObj = (Aig_Obj_t *)ppvVar2[(uint)csTarget];
      pFaninNew = Aig_And(pAig,*(Aig_Obj_t **)((long)ppvVar2[(uint)safetyInvarPO] + 8),pObj->pFanin0
                         );
      Aig_ObjPatchFanin0(pAig,pObj,pFaninNew);
      return;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void modifyAigToApplySafetyInvar(Aig_Man_t *pAig, int csTarget, int safetyInvarPO)
{
    Aig_Obj_t *pObjPOSafetyInvar, *pObjSafetyInvar;
    Aig_Obj_t *pObjPOCSTarget, *pObjCSTarget;
    Aig_Obj_t *pObjCSTargetNew;

    pObjPOSafetyInvar = Aig_ManCo( pAig, safetyInvarPO );
    pObjSafetyInvar =  Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObjPOSafetyInvar), Aig_ObjFaninC0(pObjPOSafetyInvar));    
    pObjPOCSTarget = Aig_ManCo( pAig, csTarget );
    pObjCSTarget = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObjPOCSTarget), Aig_ObjFaninC0(pObjPOCSTarget));    

    pObjCSTargetNew = Aig_And( pAig, pObjSafetyInvar, pObjCSTarget );
    Aig_ObjPatchFanin0( pAig, pObjPOCSTarget, pObjCSTargetNew );
}